

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

void __thiscall
cfd::core::ConfidentialAssetId::ConfidentialAssetId
          (ConfidentialAssetId *this,ConfidentialAssetId *object)

{
  this->_vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_006a21d8;
  ByteData::ByteData(&this->data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&(this->data_).data_,&(object->data_).data_);
  this->version_ = object->version_;
  return;
}

Assistant:

ConfidentialAssetId::ConfidentialAssetId(const ConfidentialAssetId &object) {
  data_ = object.data_;
  version_ = object.version_;
}